

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O2

void __thiscall simpleExpressionEvaluator::ExpressionEvaluator::_parse(ExpressionEvaluator *this)

{
  ostream *poVar1;
  undefined8 extraout_RAX;
  ExpressionEvaluator *this_00;
  allocator<char> local_31;
  double local_30;
  
  local_30 = _expr(this);
  if (this->_token == 0) {
    std::operator<<((ostream *)&std::cout,"The result is : ");
    poVar1 = std::ostream::_M_insert<double>(local_30);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  this_00 = (ExpressionEvaluator *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffd8,"Tokens after end of expression.",&local_31);
  _error(this_00,(string *)&stack0xffffffffffffffd8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ExpressionEvaluator::_parse()
{
	/* parse -> expr '\n' */

	auto result = _expr();
	if (_token == '\0')
		cout << "The result is : " << result << endl << endl;
	else
		_error("Tokens after end of expression.");
}